

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O0

void __thiscall vmdict_TrieNode::~vmdict_TrieNode(vmdict_TrieNode *this)

{
  vmdict_TrieNode *this_00;
  long in_RDI;
  vmdict_TrieNode *n;
  
  while (*(long *)(in_RDI + 8) != 0) {
    this_00 = *(vmdict_TrieNode **)(in_RDI + 8);
    *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x10);
    if (this_00 != (vmdict_TrieNode *)0x0) {
      ~vmdict_TrieNode(this_00);
      operator_delete(this_00,0x18);
    }
  }
  return;
}

Assistant:

~vmdict_TrieNode()
    {
        /* delete the subtree */
        while (chi != 0)
        {
            /* unlink this child */
            vmdict_TrieNode *n = chi;
            chi = chi->nxt;

            /* delete it */
            delete n;
        }
    }